

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# val_VecStr.cpp
# Opt level: O0

void __thiscall mbc::Val::VecStr::VecStr(VecStr *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  allocator local_41;
  string local_40;
  anon_class_1_0_00000001 local_1d [13];
  VecStr *local_10;
  VecStr *this_local;
  
  local_10 = this;
  _ValAtom::_ValAtom(&this->super__ValAtom);
  (this->super__ValAtom).super_ValBase._vptr_ValBase = (_func_int **)&PTR__VecStr_00192a08;
  this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)operator_new(0x18);
  (this_00->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(this_00);
  this->value_ = this_00;
  std::function<bool(std::__cxx11::string_const&)>::operator=
            ((function<bool(std::__cxx11::string_const&)> *)(this->super__ValAtom).vaild_checker_,
             local_1d);
  std::__cxx11::string::operator=
            ((string *)(this->super__ValAtom).super_ValBase.invaild_waring_,"[invaild vecstr]");
  *(this->super__ValAtom).super_ValBase.type_ = VECSTR;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"[]",&local_41);
  _ValAtom::set(&this->super__ValAtom,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return;
}

Assistant:

VecStr::VecStr() : _ValAtom() {
    value_          = new vector<string>();

    *vaild_checker_  = [](const string& str){return true;};
    *invaild_waring_ = "[invaild vecstr]";
    *type_           = Type(VECSTR);
    
    set("[]");
}